

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FunctionUsesThisSrc(Expr *pExpr,SrcList *pSrcList)

{
  bool local_59;
  SrcCount cnt;
  Walker w;
  SrcList *pSrcList_local;
  Expr *pExpr_local;
  
  cnt.pSrc._0_4_ = 0;
  cnt.pSrc._4_4_ = 0;
  sqlite3WalkExprList((Walker *)&cnt.nThis,(pExpr->x).pList);
  local_59 = 0 < (int)cnt.pSrc || cnt.pSrc._4_4_ == 0;
  return (int)local_59;
}

Assistant:

SQLITE_PRIVATE int sqlite3FunctionUsesThisSrc(Expr *pExpr, SrcList *pSrcList){
  Walker w;
  struct SrcCount cnt;
  assert( pExpr->op==TK_AGG_FUNCTION );
  w.xExprCallback = exprSrcCount;
  w.xSelectCallback = 0;
  w.u.pSrcCount = &cnt;
  cnt.pSrc = pSrcList;
  cnt.nThis = 0;
  cnt.nOther = 0;
  sqlite3WalkExprList(&w, pExpr->x.pList);
  return cnt.nThis>0 || cnt.nOther==0;
}